

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.h
# Opt level: O0

void __thiscall
wabt::TypeChecker::PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type>
          (TypeChecker *this,Result result,char *desc,Type args,Type args_1,Type args_2)

{
  initializer_list<wabt::Type> __l;
  char *desc_00;
  bool bVar1;
  allocator<wabt::Type> local_6d;
  Type local_6c;
  Type local_68;
  Type local_64;
  iterator local_60;
  size_type local_58;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_50;
  Result local_34;
  Enum local_30;
  Type local_2c;
  Type local_28;
  Type args_local_2;
  Type args_local_1;
  Type args_local;
  char *desc_local;
  TypeChecker *this_local;
  Result result_local;
  
  local_30 = result.enum_;
  local_2c = args_2;
  local_28 = args_1;
  args_local_2 = args;
  _args_local_1 = desc;
  desc_local = (char *)this;
  this_local._4_4_ = result.enum_;
  bVar1 = Failed(result);
  desc_00 = _args_local_1;
  if (bVar1) {
    local_34.enum_ = this_local._4_4_;
    local_6c = args_local_2;
    local_68 = local_28;
    local_64 = local_2c;
    local_60 = &local_6c;
    local_58 = 3;
    std::allocator<wabt::Type>::allocator(&local_6d);
    __l._M_len = local_58;
    __l._M_array = local_60;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_50,__l,&local_6d);
    PrintStackIfFailed(this,local_34,desc_00,&local_50);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_50);
    std::allocator<wabt::Type>::~allocator(&local_6d);
  }
  return;
}

Assistant:

void PrintStackIfFailed(Result result, const char* desc, Args... args) {
    // Minor optimzation, check result before constructing the vector to pass
    // to the other overload of PrintStackIfFailed.
    if (Failed(result)) {
      PrintStackIfFailed(result, desc, {args...});
    }
  }